

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

void __thiscall LTAircraft::CopyBulkData(LTAircraft *this,LTAPIBulkInfoTexts *pOut,size_t size)

{
  string *psVar1;
  char *__s;
  string local_428;
  allocator<char> local_401;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  FDDynamicData dyn;
  FDStaticData stat;
  
  if (0x107 < size) {
    LTFlightData::WaitForSafeCopyStat(&stat,this->fd);
    LTFlightData::WaitForSafeCopyDyn(&dyn,this->fd,true);
    *(unsigned_long *)pOut = (this->fd->acKey).num;
    std::__cxx11::string::string((string *)&local_220,(string *)&stat);
    strAtMost(&local_428,&local_220,7);
    strncpy((char *)(pOut + 8),local_428._M_dataplus._M_p,7);
    pOut[0xf] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::string((string *)&local_240,(string *)&stat.acTypeIcao);
    strAtMost(&local_428,&local_240,7);
    strncpy((char *)(pOut + 0x10),local_428._M_dataplus._M_p,7);
    pOut[0x17] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string((string *)&local_260,(string *)&this->pDoc8643->classification);
    strAtMost(&local_428,&local_260,3);
    strncpy((char *)(pOut + 0x18),local_428._M_dataplus._M_p,3);
    pOut[0x1b] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::string((string *)&local_280,(string *)&this->pDoc8643->wtc);
    strAtMost(&local_428,&local_280,3);
    strncpy((char *)(pOut + 0x1c),local_428._M_dataplus._M_p,3);
    pOut[0x1f] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_2a0,(string *)&stat.opIcao);
    strAtMost(&local_428,&local_2a0,7);
    strncpy((char *)(pOut + 0x20),local_428._M_dataplus._M_p,7);
    pOut[0x27] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&stat.man);
    strAtMost(&local_428,&local_2c0,0x27);
    strncpy((char *)(pOut + 0x28),local_428._M_dataplus._M_p,0x27);
    pOut[0x4f] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::string((string *)&local_2e0,(string *)&stat.mdl);
    strAtMost(&local_428,&local_2e0,0x27);
    strncpy((char *)(pOut + 0x50),local_428._M_dataplus._M_p,0x27);
    pOut[0x77] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::string((string *)&local_300,(string *)&stat.catDescr);
    strAtMost(&local_428,&local_300,0x27);
    strncpy((char *)(pOut + 0x78),local_428._M_dataplus._M_p,0x27);
    pOut[0x9f] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::string((string *)&local_320,(string *)&stat.op);
    strAtMost(&local_428,&local_320,0x27);
    strncpy((char *)(pOut + 0xa0),local_428._M_dataplus._M_p,0x27);
    pOut[199] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::string((string *)&local_340,(string *)&stat.call);
    strAtMost(&local_428,&local_340,7);
    strncpy((char *)(pOut + 200),local_428._M_dataplus._M_p,7);
    pOut[0xcf] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_340);
    LTFlightData::FDDynamicData::GetSquawk_abi_cxx11_(&local_360,&dyn);
    strAtMost(&local_428,&local_360,7);
    strncpy((char *)(pOut + 0xd0),local_428._M_dataplus._M_p,7);
    pOut[0xd7] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::string((string *)&local_380,(string *)&stat.flight);
    strAtMost(&local_428,&local_380,7);
    strncpy((char *)(pOut + 0xd8),local_428._M_dataplus._M_p,7);
    pOut[0xdf] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_380);
    psVar1 = stat.stops.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (stat.stops.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        stat.stops.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar1 = &LTFlightData::FDStaticData::emptyStr_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)&local_3a0,(string *)psVar1);
    strAtMost(&local_428,&local_3a0,7);
    strncpy((char *)(pOut + 0xe0),local_428._M_dataplus._M_p,7);
    pOut[0xe7] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_3a0);
    if ((ulong)((long)stat.stops.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)stat.stops.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      psVar1 = &LTFlightData::FDStaticData::emptyStr_abi_cxx11_;
    }
    else {
      psVar1 = stat.stops.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
    }
    std::__cxx11::string::string((string *)&local_3c0,(string *)psVar1);
    strAtMost(&local_428,&local_3c0,7);
    strncpy((char *)(pOut + 0xe8),local_428._M_dataplus._M_p,7);
    pOut[0xef] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_3c0);
    if (dyn.pChannel == (LTChannel *)0x0) {
      __s = "-";
    }
    else {
      __s = (dyn.pChannel)->pszChName;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,__s,&local_401);
    strAtMost(&local_428,&local_3e0,0x17);
    strncpy((char *)(pOut + 0xf0),local_428._M_dataplus._M_p,0x17);
    pOut[0x107] = (LTAPIBulkInfoTexts)0x0;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_3e0);
    if (size < 0x130) {
      if (0x11f < size) {
        psVar1 = XPMP2::Aircraft::GetModelName_abi_cxx11_(&this->super_Aircraft);
        strncpy((char *)(pOut + 0x108),(psVar1->_M_dataplus)._M_p,0x17);
        pOut[0x11f] = (LTAPIBulkInfoTexts)0x0;
      }
    }
    else {
      psVar1 = XPMP2::Aircraft::GetModelName_abi_cxx11_(&this->super_Aircraft);
      std::__cxx11::string::string((string *)&local_400,(string *)psVar1);
      strAtMost(&local_428,&local_400,0x27);
      strncpy((char *)(pOut + 0x108),local_428._M_dataplus._M_p,0x27);
      pOut[0x12f] = (LTAPIBulkInfoTexts)0x0;
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_400);
    }
    LTFlightData::FDStaticData::~FDStaticData(&stat);
  }
  return;
}

Assistant:

void LTAircraft::CopyBulkData (LTAPIAircraft::LTAPIBulkInfoTexts* pOut,
                               size_t size) const
{
    // If size isn't enough for original structure we bail:
    if (size < LTAPIBulkInfoTexts_v120)
        return;
    
    // Fill the output buffer one by one
    const LTFlightData::FDStaticData stat = fd.WaitForSafeCopyStat();
    const LTFlightData::FDDynamicData dyn = fd.WaitForSafeCopyDyn();
    pOut->keyNum = fd.key().num;
    STRCPY_ATMOST(pOut->registration,   stat.reg);
    // aircraft model/operator
    STRCPY_ATMOST(pOut->modelIcao,      stat.acTypeIcao);
    STRCPY_ATMOST(pOut->acClass,        pDoc8643->classification);
    STRCPY_ATMOST(pOut->wtc,            pDoc8643->wtc);
    STRCPY_ATMOST(pOut->opIcao,         stat.opIcao);
    STRCPY_ATMOST(pOut->man,            stat.man);
    STRCPY_ATMOST(pOut->model,          stat.mdl);
    STRCPY_ATMOST(pOut->catDescr,       stat.catDescr);
    STRCPY_ATMOST(pOut->op,             stat.op);
    // flight data
    STRCPY_ATMOST(pOut->callSign,       stat.call);
    STRCPY_ATMOST(pOut->squawk,         dyn.GetSquawk());
    STRCPY_ATMOST(pOut->flightNumber,   stat.flight);
    STRCPY_ATMOST(pOut->origin,         stat.origin());
    STRCPY_ATMOST(pOut->destination,    stat.dest());
    STRCPY_ATMOST(pOut->trackedBy,      dyn.pChannel ? dyn.pChannel->ChName() : "-");
    
    // v2.40 additions (cslModel field extended to 40 chars)
    if (size >= LTAPIBulkInfoTexts_v240) {
        STRCPY_ATMOST(pOut->cslModel, GetModelName());
    }
    // v1.22 additions (cslModel field had 24 chars only)
    else if (size >= LTAPIBulkInfoTexts_v122) {
        strncpy_s(pOut->cslModel, 24, GetModelName().c_str(), 23);
    }
}